

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O3

int __thiscall
NaPNFetcher::verify(NaPNFetcher *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                   size_t tbslen)

{
  int iVar1;
  uint uVar2;
  NaVector *pNVar3;
  long lVar4;
  int iVar5;
  undefined8 unaff_RBX;
  uint uVar6;
  char *fmt;
  
  iVar1 = this->nOutDim;
  if ((long)iVar1 < 0) {
    fmt = "VERIFY FAILED: output dimension is not set!\n";
  }
  else {
    iVar5 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    if (this->pfSumWeights != (NaReal *)0x0) {
      return iVar5;
    }
    if (iVar1 == 0) {
      uVar6 = 0;
    }
    else {
      lVar4 = 0;
      uVar6 = 0;
      do {
        if (uVar6 <= this->piOutMap[lVar4]) {
          uVar6 = this->piOutMap[lVar4];
        }
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
    pNVar3 = NaPetriCnInput::data(&this->in);
    uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
    if (uVar6 < uVar2) {
      return iVar5;
    }
    fmt = "VERIFY FAILED: some output positions are out of input range!\n";
  }
  NaPrintLog(fmt);
  return 0;
}

Assistant:

bool
NaPNFetcher::verify ()
{
  if(nOutDim < 0){
    NaPrintLog("VERIFY FAILED: output dimension is not set!\n");
    return false;
  }

  if(NULL == pfSumWeights)
    {
      int	i;
      unsigned	iMaxPos = 0;
      for(i = 0; i < nOutDim; ++i){
	if(iMaxPos < piOutMap[i])
	  iMaxPos = piOutMap[i];
      }

      if((unsigned)iMaxPos >= in.data().dim()){
	NaPrintLog("VERIFY FAILED: some output positions are out "\
		   "of input range!\n");
	return false;
      }
    }

  return true;
}